

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrAsciiOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  long lVar8;
  anon_union_16_2_67f50693_for_value local_70;
  ulong local_60;
  anon_union_16_2_67f50693_for_value local_58;
  idx_t local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ldata->value + lVar8 * 2);
        local_70._0_8_ = *puVar1;
        local_70.pointer.ptr = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)&rdata->value + lVar8 * 2);
        local_58._0_8_ = *puVar1;
        local_58.pointer.ptr = (char *)puVar1[1];
        iVar3 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_58.pointer);
        *(idx_t *)((long)result_data + lVar8) = iVar3 + 1;
        lVar8 = lVar8 + 8;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_38 = 0;
    uVar5 = 0;
    local_48 = count;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar2[local_38];
      }
      uVar4 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar4 = count;
      }
      uVar6 = uVar4;
      if (uVar7 != 0) {
        uVar6 = uVar5;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar5 < uVar4) {
            lVar8 = uVar5 * 2 + 1;
            do {
              puVar1 = (undefined8 *)((long)ldata + lVar8 * 8 + -8);
              local_70._0_8_ = *puVar1;
              local_70.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + lVar8 * 8 + -8);
              local_58._0_8_ = *puVar1;
              local_58.pointer.ptr = (char *)puVar1[1];
              iVar3 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_58.pointer);
              result_data[uVar5] = iVar3 + 1;
              uVar5 = uVar5 + 1;
              lVar8 = lVar8 + 2;
              uVar6 = uVar5;
            } while (uVar4 != uVar5);
          }
        }
        else if (uVar5 < uVar4) {
          lVar8 = uVar5 * 2 + 1;
          uVar6 = 0;
          do {
            if ((uVar7 >> (uVar6 & 0x3f) & 1) != 0) {
              puVar1 = (undefined8 *)((long)ldata + lVar8 * 8 + -8);
              local_70._0_8_ = *puVar1;
              local_70.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + lVar8 * 8 + -8);
              local_58._0_8_ = *puVar1;
              local_58.pointer.ptr = (char *)puVar1[1];
              iVar3 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_58.pointer);
              result_data[uVar5 + uVar6] = iVar3 + 1;
            }
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 2;
          } while ((uVar5 - uVar4) + uVar6 != 0);
          uVar6 = uVar5 + uVar6;
          count = local_48;
        }
      }
      local_38 = local_38 + 1;
      uVar5 = uVar6;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}